

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O0

string * __thiscall
FIX::DoubleConvertor::convert_abi_cxx11_
          (string *__return_storage_ptr__,DoubleConvertor *this,double value,int padding,
          int significant_digits)

{
  ulong uVar1;
  int iVar2;
  bool bVar3;
  allocator local_69;
  int local_68;
  int local_64;
  int discard;
  int needed;
  char *point;
  undefined1 auStack_50 [4];
  int size;
  char *end;
  char result [32];
  int significant_digits_local;
  int padding_local;
  double value_local;
  
  iVar2 = (int)this;
  _auStack_50 = (char **)0x0;
  if ((((value == 0.0) && (!NAN(value))) || (0.0001 < value)) || (value < -0.0001)) {
    point._4_4_ = FIX::DoubleConvertor::fast_dtoa((char *)&end,0x20,value,padding);
    if (point._4_4_ == 0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    if (0 < iVar2) {
      _discard = &end;
      _auStack_50 = (char **)((long)&size + (long)point._4_4_ + 3);
      while( true ) {
        bVar3 = false;
        if (*(char *)_discard != '.') {
          bVar3 = *(char *)_discard != '\0';
        }
        if (!bVar3) break;
        _discard = (char **)((long)_discard + 1);
      }
      if (*(char *)_discard == '\0') {
        _auStack_50 = _discard;
        *(char *)_discard = '.';
        point._4_4_ = point._4_4_ + 1;
      }
      local_64 = iVar2 - ((int)_auStack_50 - (int)_discard);
      if (0 < local_64) {
        _auStack_50 = (char **)((long)_auStack_50 + 1);
        memset(_auStack_50,0x30,(long)local_64);
        point._4_4_ = local_64 + point._4_4_;
      }
    }
  }
  else {
    point._4_4_ = FIX::DoubleConvertor::fast_fixed_dtoa((char *)&end,0x20,value,padding);
    if (point._4_4_ == 0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    _auStack_50 = (char **)((long)&size + (long)point._4_4_ + 3);
    if (iVar2 < 1) {
      for (; *(char *)_auStack_50 == '0'; _auStack_50 = (char **)((long)_auStack_50 + -1)) {
        point._4_4_ = point._4_4_ + -1;
      }
    }
    else {
      local_68 = padding - iVar2;
      while( true ) {
        iVar2 = local_68;
        if (*(char *)_auStack_50 == '0') {
          local_68 = local_68 + -1;
        }
        if (*(char *)_auStack_50 != '0' || iVar2 < 1) break;
        _auStack_50 = (char **)((long)_auStack_50 + -1);
        point._4_4_ = point._4_4_ + -1;
      }
    }
  }
  uVar1 = (ulong)point._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)&end,uVar1,&local_69);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  return __return_storage_ptr__;
}

Assistant:

static std::string convert(double value, int padding = 0, int significant_digits = SIGNIFICANT_DIGITS) {
    char result[BUFFFER_SIZE];
    char *end = 0;

    int size;
    if (value == 0 || value > 0.0001 || value < -0.0001) {
      size = fast_dtoa(result, BUFFFER_SIZE, value, significant_digits);
      if (size == 0) {
        return std::string();
      }

      if (padding > 0) {
        char *point = result;
        end = result + size - 1;
        while (*point != '.' && *point != 0) {
          point++;
        }

        if (*point == 0) {
          end = point;
          *point = '.';
          ++size;
        }
        int needed = padding - (int)(end - point);

        if (needed > 0) {
          memset(++end, '0', needed);
          size += needed;
        }
      }
    } else {
      size = fast_fixed_dtoa(result, BUFFFER_SIZE, value, significant_digits);
      if (size == 0) {
        return std::string();
      }

      // strip trailing 0's
      end = result + size - 1;

      if (padding > 0) {
        int discard = significant_digits - padding;

        while ((*end == '0') && (discard-- > 0)) {
          --end;
          --size;
        }
      } else {
        while (*end == '0') {
          --end;
          --size;
        }
      }
    }

    return std::string(result, size);
  }